

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::Interpreter::ReParseMultiNetworkSyntax
          (Error *__return_storage_ptr__,Interpreter *this,Expression *aExpr,Expression *aRetExpr)

{
  bool bVar1;
  v10 *pvVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  anon_class_1_0_00000001 local_2ea;
  v10 local_2e9;
  v10 *local_2e8;
  char *local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  Error local_2b8;
  int local_290;
  anon_class_1_0_00000001 local_28a;
  v10 local_289;
  v10 *local_288;
  char *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  Error local_258;
  undefined1 local_220 [8];
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *word;
  const_iterator __end2;
  const_iterator __begin2;
  Expression *__range2;
  string lastKey;
  bool inKey;
  uint8_t state;
  StringArray *arrays [6];
  Expression *aRetExpr_local;
  Expression *aExpr_local;
  Interpreter *this_local;
  Error *error;
  undefined1 local_158 [16];
  v10 *local_148;
  char *local_140;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_138;
  v10 *local_130;
  char *pcStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_118 [3];
  undefined1 local_100 [16];
  v10 *local_f0;
  char *local_e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_e0;
  v10 *local_d8;
  char *pcStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  v10 **local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_a0;
  undefined1 *local_98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_90;
  undefined8 local_88;
  undefined1 *local_80;
  Error **local_78;
  undefined1 *local_70;
  Error **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  Error **local_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_48;
  v10 **local_40;
  v10 *local_38;
  char *pcStack_30;
  v10 **local_20;
  v10 *local_18;
  char *pcStack_10;
  
  arrays[1] = &(this->mContext).mDomAliases;
  arrays[2] = &(this->mContext).mExportFiles;
  arrays[3] = &(this->mContext).mImportFiles;
  arrays[4] = &(this->mContext).mCommandKeys;
  lastKey.field_2._M_local_buf[0xf] = '\0';
  arrays[0] = (StringArray *)this;
  arrays[5] = aRetExpr;
  Error::Error(__return_storage_ptr__);
  lastKey.field_2._M_local_buf[0xe] = '\0';
  lastKey.field_2._M_local_buf[0xd] = '\0';
  std::__cxx11::string::string((string *)&__range2);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(aExpr);
  word = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(aExpr);
  do {
    pvVar2 = (v10 *)&word;
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)pvVar2);
    if (!bVar1) {
      if ((lastKey.field_2._M_local_buf[0xd] & 1U) != 0) {
        ReParseMultiNetworkSyntax::anon_class_1_0_00000001::operator()(&local_2ea);
        local_a8 = &local_2e8;
        local_b0 = &local_2e9;
        bVar3 = ::fmt::v10::operator()(local_b0);
        local_2e0 = (char *)bVar3.size_;
        local_2e8 = (v10 *)bVar3.data_;
        ::fmt::v10::detail::
        check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        local_120 = &local_2d8;
        local_130 = local_2e8;
        pcStack_128 = local_2e0;
        local_138 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&__range2;
        local_20 = &local_130;
        local_148 = local_2e8;
        local_140 = local_2e0;
        local_18 = local_148;
        pcStack_10 = local_140;
        error = (Error *)::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                   (local_138,pvVar2,local_120);
        local_70 = local_158;
        local_78 = &error;
        local_60 = 0xd;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = local_140;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_78;
        local_68 = local_78;
        local_58 = local_70;
        local_50 = local_78;
        ::fmt::v10::vformat_abi_cxx11_(&local_2d8,local_148,fmt_00,args_00);
        Error::Error(&local_2b8,kInvalidArgs,&local_2d8);
        Error::operator=(__return_storage_ptr__,&local_2b8);
        Error::~Error(&local_2b8);
        std::__cxx11::string::~string((string *)&local_2d8);
      }
LAB_0025fe60:
      lastKey.field_2._M_local_buf[0xf] = '\x01';
      local_290 = 1;
LAB_0025fe71:
      std::__cxx11::string::~string((string *)&__range2);
      if ((lastKey.field_2._M_local_buf[0xf] & 1U) == 0) {
        Error::~Error(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    prefix.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end2);
    std::__cxx11::string::substr((ulong)local_220,prefix.field_2._8_8_);
    pvVar2 = (v10 *)0x3b7352;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_220,"--");
    if (bVar1) {
      if ((lastKey.field_2._M_local_buf[0xd] & 1U) == 0) {
        std::__cxx11::string::operator=((string *)&__range2,(string *)prefix.field_2._8_8_);
        lastKey.field_2._M_local_buf[0xd] = '\x01';
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )prefix.field_2._8_8_,"--nwk");
        if (bVar1) {
          lastKey.field_2._M_local_buf[0xe] = '\x01';
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)prefix.field_2._8_8_,"--dom");
          if (bVar1) {
            lastKey.field_2._M_local_buf[0xe] = '\x02';
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)prefix.field_2._8_8_,"--export");
            if (bVar1) {
              lastKey.field_2._M_local_buf[0xe] = '\x03';
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)prefix.field_2._8_8_,"--import");
              if (bVar1) {
                lastKey.field_2._M_local_buf[0xe] = '\x04';
              }
              else {
                lastKey.field_2._M_local_buf[0xd] = '\0';
                lastKey.field_2._M_local_buf[0xe] = '\x05';
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(arrays[4],(value_type *)prefix.field_2._8_8_);
              }
            }
          }
        }
        goto LAB_0025fc1b;
      }
      ReParseMultiNetworkSyntax::anon_class_1_0_00000001::operator()(&local_28a);
      local_b8 = &local_288;
      local_c0 = &local_289;
      bVar3 = ::fmt::v10::operator()(local_c0);
      local_280 = (char *)bVar3.size_;
      local_288 = (v10 *)bVar3.data_;
      ::fmt::v10::detail::
      check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      local_c8 = &local_278;
      local_d8 = local_288;
      pcStack_d0 = local_280;
      local_e0 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&__range2;
      local_40 = &local_d8;
      local_f0 = local_288;
      local_e8 = local_280;
      local_38 = local_f0;
      pcStack_30 = local_e8;
      local_118[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                               (local_e0,pvVar2,local_c8);
      local_98 = local_100;
      local_a0 = local_118;
      local_88 = 0xd;
      fmt.size_ = 0xd;
      fmt.data_ = local_e8;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_a0;
      local_90 = local_a0;
      local_80 = local_98;
      local_48 = local_a0;
      ::fmt::v10::vformat_abi_cxx11_(&local_278,local_f0,fmt,args);
      Error::Error(&local_258,kInvalidArgs,&local_278);
      Error::operator=(__return_storage_ptr__,&local_258);
      Error::~Error(&local_258);
      std::__cxx11::string::~string((string *)&local_278);
      local_290 = 6;
    }
    else {
      lastKey.field_2._M_local_buf[0xd] = '\0';
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(arrays[(ulong)(byte)lastKey.field_2._M_local_buf[0xe] - 1],
                  (value_type *)prefix.field_2._8_8_);
LAB_0025fc1b:
      local_290 = 0;
    }
    std::__cxx11::string::~string((string *)local_220);
    if (local_290 != 0) {
      if (local_290 != 6) goto LAB_0025fe71;
      goto LAB_0025fe60;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

Error Interpreter::ReParseMultiNetworkSyntax(const Expression &aExpr, Expression &aRetExpr)
{
    enum
    {
        ST_COMMAND,
        ST_NETWORK,
        ST_DOMAIN,
        ST_EXPORT,
        ST_IMPORT,
        ST_CMD_KEYS
    };
    StringArray *arrays[] = {[ST_COMMAND]  = &aRetExpr,
                             [ST_NETWORK]  = &mContext.mNwkAliases,
                             [ST_DOMAIN]   = &mContext.mDomAliases,
                             [ST_EXPORT]   = &mContext.mExportFiles,
                             [ST_IMPORT]   = &mContext.mImportFiles,
                             [ST_CMD_KEYS] = &mContext.mCommandKeys};
    Error        error;

    uint8_t     state = ST_COMMAND;
    bool        inKey = false;
    std::string lastKey;

    for (const auto &word : aExpr)
    {
        std::string prefix = word.substr(0, 2);

        /*
         * Note: the syntax allows multiple specification of the same key
         *
         * Example: the cases below are parsed equivalently
         *  --nwk nid1 nid2 nid3 --export path
         *  --nwk nid1 --nwk nid2 nid3 --export path
         *  --nwk nid1 --export path --nwk nid2 --nwk nid3
         */

        if (prefix == "--")
        {
            VerifyOrExit(!inKey, error = ERROR_INVALID_ARGS(SYNTAX_NO_PARAM, lastKey));
            lastKey = word;
            inKey   = true;
            if (word == KEYWORD_NETWORK)
                state = ST_NETWORK;
            else if (word == KEYWORD_DOMAIN)
                state = ST_DOMAIN;
            else if (word == KEYWORD_EXPORT)
                state = ST_EXPORT;
            else if (word == KEYWORD_IMPORT)
                state = ST_IMPORT;
            else
            {
                // Some commands have command line parameters that are to be passed without any change including the
                // key.
                inKey = false;
                state = ST_CMD_KEYS;
                arrays[state]->push_back(word);
            }
        }
        else
        {
            inKey = false;
            // Note: avoid accidental conversion of the PSKd to lower case (see TS 8.2, Joining Device Credential
            // in the table 8.2
            arrays[state]->push_back(word);
        }
    }
    if (inKey) // test if we exit for() with trailing keyword
    {
        error = ERROR_INVALID_ARGS(SYNTAX_NO_PARAM, lastKey);
    }
exit:
    return error;
}